

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall
spdlog::synchronous_factory::
create<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>,std::__cxx11::string_const&,bool&,spdlog::file_event_handlers_const&>
          (synchronous_factory *this,string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,bool *args_1,
          file_event_handlers *args_2)

{
  registry *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar1;
  shared_ptr<spdlog::logger> local_68 [2];
  undefined1 local_41;
  undefined1 local_40 [8];
  shared_ptr<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>_> sink;
  file_event_handlers *args_local_2;
  bool *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *logger_name_local;
  shared_ptr<spdlog::logger> *new_logger;
  
  sink.
  super___shared_ptr<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_2;
  std::
  make_shared<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>,std::__cxx11::string_const&,bool&,spdlog::file_event_handlers_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (bool *)args,(file_event_handlers *)args_1);
  local_41 = 0;
  std::
  make_shared<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (shared_ptr<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>_> *)logger_name
            );
  this_00 = details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr(local_68,(shared_ptr<spdlog::logger> *)this);
  details::registry::initialize_logger(this_00,local_68);
  std::shared_ptr<spdlog::logger>::~shared_ptr(local_68);
  local_41 = 1;
  std::shared_ptr<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>_> *)local_40);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args) {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }